

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_tests.cpp
# Opt level: O3

void __thiscall
logging_tests::logging_LogPrintMacros_CategoryName::test_method
          (logging_LogPrintMacros_CategoryName *this)

{
  long lVar1;
  pointer pcVar2;
  pointer pcVar3;
  LogFlags category_00;
  pointer ppVar4;
  bool bVar5;
  char cVar6;
  Logger *pLVar7;
  void *pvVar8;
  size_type sVar9;
  istream *piVar10;
  undefined8 uVar11;
  ulong uVar12;
  iterator in_R8;
  iterator in_R9;
  pointer pcVar13;
  pointer pbVar14;
  pointer ppVar15;
  long in_FS_OFFSET;
  const_string file_00;
  string_view str;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  string_view source_file;
  string_view logging_function;
  string_view separators;
  check_type cVar16;
  char *local_368;
  char *local_360;
  equal_coll_impl local_351;
  LogFlags category;
  shared_count local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  log_lines;
  char *local_2f8;
  char *local_2f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  category_names;
  vector<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  expected_category_names;
  ifstream file;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270 [31];
  string log;
  string concatenated_category_names;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pLVar7 = LogInstance();
  BCLog::Logger::EnableCategory(pLVar7,ALL);
  pLVar7 = LogInstance();
  BCLog::Logger::LogCategoriesString_abi_cxx11_(&concatenated_category_names,pLVar7);
  expected_category_names.
  super__Vector_base<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  expected_category_names.
  super__Vector_base<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  expected_category_names.
  super__Vector_base<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _file = concatenated_category_names._M_dataplus._M_p;
  log._M_dataplus._M_p._0_1_ = 0x2c;
  separators._M_str = in_R8;
  separators._M_len = (size_t)&log;
  util::Split<std::__cxx11::string>
            (&category_names,(util *)&file,(Span<const_char> *)0x1,separators);
  if (category_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      category_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar14 = category_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar2 = (pbVar14->_M_dataplus)._M_p;
      pcVar3 = (pointer)pbVar14->_M_string_length;
      log._M_dataplus._M_p = pcVar3;
      log._M_string_length = (size_type)pcVar2;
      if (pcVar3 != (pointer)0x0) {
        pcVar13 = (pointer)0x0;
        do {
          pvVar8 = memchr(" \f\n\r\t\v",(int)pcVar13[(long)pcVar2],6);
          if (pvVar8 == (void *)0x0) {
            if (pcVar13 != (pointer)0xffffffffffffffff) {
              sVar9 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                                ((basic_string_view<char,_std::char_traits<char>_> *)&log,
                                 " \f\n\r\t\v",0xffffffffffffffff,6);
              if (log._M_dataplus._M_p < pcVar13) {
                if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                  uVar11 = std::__throw_out_of_range_fmt
                                     ("%s: __pos (which is %zu) > __size (which is %zu)",
                                      "basic_string_view::substr",pcVar13);
                  boost::detail::shared_count::~shared_count(&local_340);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&log_lines);
                  std::ifstream::~ifstream(&file);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&expected);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&category_names);
                  std::
                  vector<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~vector(&expected_category_names);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)concatenated_category_names._M_dataplus._M_p !=
                      &concatenated_category_names.field_2) {
                    operator_delete(concatenated_category_names._M_dataplus._M_p,
                                    concatenated_category_names.field_2._M_allocated_capacity + 1);
                  }
                  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                    _Unwind_Resume(uVar11);
                  }
                }
                goto LAB_0041e52a;
              }
              uVar12 = (sVar9 - (long)pcVar13) + 1;
              if ((ulong)((long)log._M_dataplus._M_p - (long)pcVar13) < uVar12) {
                uVar12 = (long)log._M_dataplus._M_p - (long)pcVar13;
              }
              pcVar13 = pcVar13 + log._M_string_length;
              goto LAB_0041de68;
            }
            break;
          }
          pcVar13 = pcVar13 + 1;
        } while (pcVar3 != pcVar13);
      }
      pcVar13 = (pointer)0x0;
      uVar12 = 0;
LAB_0041de68:
      _file = (pointer)local_270;
      std::__cxx11::string::_M_construct<char_const*>((string *)&file,pcVar13,pcVar13 + uVar12);
      local_2c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
      ;
      local_2b8 = "";
      local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0xa4;
      file_00.m_begin = (iterator)&local_2c0;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2d0,
                 msg);
      _cVar16 = 0x41dee7;
      str._M_str = _file;
      str._M_len = concatenated_category_names._M_string_length;
      bVar5 = GetLogCategory(&category,str);
      expected.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(expected.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar5);
      expected.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      expected.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      log_lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_bce369;
      log_lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xe7eb84;
      log._M_string_length = log._M_string_length & 0xffffffffffffff00;
      log._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01389048;
      log.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      log.field_2._8_8_ = &log_lines;
      local_2f8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
      ;
      local_2f0 = "";
      in_R8 = (iterator)0x2;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&expected,(lazy_ostream *)&log,2,0,WARN,_cVar16,
                 (size_t)&local_2f8,0xa4);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &expected.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::pair<BCLog::LogFlags,std::__cxx11::string>,std::allocator<std::pair<BCLog::LogFlags,std::__cxx11::string>>>
      ::emplace_back<BCLog::LogFlags&,std::__cxx11::string_const&>
                ((vector<std::pair<BCLog::LogFlags,std::__cxx11::string>,std::allocator<std::pair<BCLog::LogFlags,std::__cxx11::string>>>
                  *)&expected_category_names,&category,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_file != local_270) {
        operator_delete(_file,local_270[0]._M_allocated_capacity + 1);
      }
      pbVar14 = pbVar14 + 1;
    } while (pbVar14 !=
             category_names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  ppVar4 = expected_category_names.
           super__Vector_base<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (expected_category_names.
      super__Vector_base<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      expected_category_names.
      super__Vector_base<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar15 = expected_category_names.
              super__Vector_base<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      category_00 = ppVar15->first;
      pLVar7 = LogInstance();
      bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar7,category_00,Debug);
      if (bVar5) {
        in_R9 = (iterator)ppVar15->first;
        in_R8 = (iterator)0xaa;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
        ;
        source_file._M_len = 0x66;
        logging_function._M_str = "test_method";
        logging_function._M_len = 0xb;
        LogPrintFormatInternal<char[4]>
                  (logging_function,source_file,0xaa,(LogFlags)in_R9,Debug,
                   (ConstevalFormatString<1U>)0xe7eb85,(char (*) [4])0xf4accd);
      }
      _file = (pointer)local_270;
      std::__cxx11::string::_M_construct<char_const*>((string *)&file,"[","");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                 (ppVar15->second)._M_dataplus._M_p,(ppVar15->second)._M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                 "] foo: bar");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&expected,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_file != local_270) {
        operator_delete(_file,local_270[0]._M_allocated_capacity + 1);
      }
      ppVar15 = ppVar15 + 1;
    } while (ppVar15 != ppVar4);
  }
  std::ifstream::ifstream
            ((istream *)&file,
             (this->super_LogSetup).tmp_log_path.super_path._M_pathname._M_dataplus._M_p,_S_in);
  log_lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  log_lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  log_lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  log._M_string_length = 0;
  log.field_2._M_allocated_capacity = log.field_2._M_allocated_capacity & 0xffffffffffffff00;
  log._M_dataplus._M_p = (pointer)&log.field_2;
  while( true ) {
    cVar6 = std::ios::widen((char)*(undefined8 *)(_file + -0x18) + (char)(istream *)&file);
    piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&file,(string *)&log,cVar6);
    if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&log_lines,&log);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)log._M_dataplus._M_p != &log.field_2) {
    operator_delete(log._M_dataplus._M_p,log.field_2._M_allocated_capacity + 1);
  }
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xb6;
  file_01.m_begin = (iterator)&local_328;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_338,
             msg_00);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            ((assertion_result *)&category,&local_351,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )log_lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )log_lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )expected.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )expected.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  log._M_string_length = log._M_string_length & 0xffffffffffffff00;
  log._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f08;
  log.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  log.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
  ;
  local_360 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&category,(lazy_ostream *)&log,1,0xd,4,0xe7ea06,(size_t)&local_368,
             0xb6,"log_lines.end()","expected.begin()","expected.end()");
  boost::detail::shared_count::~shared_count(&local_340);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&log_lines);
  std::ifstream::~ifstream(&file);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expected);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&category_names);
  std::
  vector<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&expected_category_names);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)concatenated_category_names._M_dataplus._M_p != &concatenated_category_names.field_2) {
    operator_delete(concatenated_category_names._M_dataplus._M_p,
                    concatenated_category_names.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_0041e52a:
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(logging_LogPrintMacros_CategoryName, LogSetup)
{
    LogInstance().EnableCategory(BCLog::LogFlags::ALL);
    const auto concatenated_category_names = LogInstance().LogCategoriesString();
    std::vector<std::pair<BCLog::LogFlags, std::string>> expected_category_names;
    const auto category_names = SplitString(concatenated_category_names, ',');
    for (const auto& category_name : category_names) {
        BCLog::LogFlags category;
        const auto trimmed_category_name = TrimString(category_name);
        BOOST_REQUIRE(GetLogCategory(category, trimmed_category_name));
        expected_category_names.emplace_back(category, trimmed_category_name);
    }

    std::vector<std::string> expected;
    for (const auto& [category, name] : expected_category_names) {
        LogDebug(category, "foo: %s\n", "bar");
        std::string expected_log = "[";
        expected_log += name;
        expected_log += "] foo: bar";
        expected.push_back(expected_log);
    }

    std::ifstream file{tmp_log_path};
    std::vector<std::string> log_lines;
    for (std::string log; std::getline(file, log);) {
        log_lines.push_back(log);
    }
    BOOST_CHECK_EQUAL_COLLECTIONS(log_lines.begin(), log_lines.end(), expected.begin(), expected.end());
}